

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.hpp
# Opt level: O0

IStreamer * __thiscall LiteScript::IStreamer::operator>>(IStreamer *this,int *v)

{
  int iVar1;
  int *v_local;
  IStreamer *this_local;
  
  iVar1 = Read<int>(this->stream);
  *v = iVar1;
  return this;
}

Assistant:

IStreamer& operator>>(T& v) {
            v = Read<T>(this->stream);
            return *this;
        }